

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

char * bit_to_str(uchar val,int num)

{
  char *in_RAX;
  uint uVar1;
  
  bit_to_str::b[0] = '\0';
  for (uVar1 = 8; uVar1 != 0; uVar1 = uVar1 >> 1) {
    in_RAX = (char *)strlen(bit_to_str::b);
    *(ushort *)(in_RAX + 0x10a201) = ((uVar1 & ~(uint)val) == 0) + 0x30;
  }
  return in_RAX;
}

Assistant:

inline static const char *bit_to_str(unsigned char val, int num) {
  static char b[9];
  unsigned char x = val & (-1 >> (8 - num));
  b[0] = '\0';
  int z;
  for (z = 1 << (num - 1); z > 0; z >>= 1) {
    // strcat_s(b,9, ((x & z) == z) ? "1" : "0");
    strcat(b,((x & z) == z) ? "1" : "0");
  }

  return b;
}